

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::WrappedType<signed_char>>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 WrappedType<signed_char> min,WrappedType<signed_char> max,float gridSize)

{
  int iVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  ushort uVar7;
  int iVar8;
  char cVar9;
  char cVar10;
  long lVar11;
  byte bVar12;
  char cVar13;
  int iVar14;
  int iVar15;
  byte bVar16;
  char cVar17;
  WrappedType<signed_char> WVar18;
  char cVar19;
  ulong uVar20;
  byte bVar21;
  char cVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  float fVar26;
  deRandom rnd;
  byte local_b8;
  uint local_a4;
  ulong local_90;
  deRandom local_80;
  char *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  char *local_48;
  ulong local_40;
  ulong local_38;
  
  uVar20 = (ulong)(uint)stride;
  if (stride == 0) {
    uVar20 = (ulong)(uint)componentCount;
  }
  iVar14 = (int)uVar20;
  local_38 = (ulong)(uint)(iVar14 * 2);
  iVar8 = iVar14 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar8 = 0;
  }
  local_70 = (char *)operator_new__((long)(iVar8 * count + offset));
  deRandom_init(&local_80,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    uVar23 = (uint)min.m_value;
    fVar26 = (float)(int)max.m_value - (float)(int)uVar23;
    uVar24 = -(uint)(-fVar26 <= fVar26);
    iVar4 = (int)((float)(~uVar24 & (uint)-fVar26 | (uint)fVar26 & uVar24) * gridSize);
    uVar7 = 4;
    if ('\x04' < (char)iVar4) {
      uVar7 = (ushort)iVar4;
    }
    if (0 < count) {
      local_b8 = (byte)uVar7;
      iVar4 = (int)(char)local_b8;
      local_48 = local_70 + offset;
      uVar24 = (int)max.m_value - uVar23;
      local_50 = (ulong)(uint)(iVar14 * 3);
      local_58 = (ulong)(uint)(iVar14 * 4);
      local_60 = (ulong)(uint)(iVar14 * 5);
      iVar14 = 2;
      iVar15 = 3;
      local_90 = 0;
      local_68 = (ulong)(uint)count;
      local_40 = uVar20;
      do {
        local_a4 = 0;
        while( true ) {
          sVar2 = (short)min.m_value;
          sVar3 = sVar2;
          WVar18.m_value = min.m_value;
          if (min.m_value < max.m_value) {
            dVar5 = deRandom_getUint32(&local_80);
            WVar18.m_value = (char)(dVar5 % uVar24) + min.m_value;
            sVar3 = (short)WVar18.m_value;
          }
          cVar19 = WVar18.m_value - (char)(sVar3 % (short)(uVar7 & 0xff));
          bVar12 = max.m_value - cVar19 & 0x7f;
          bVar21 = local_b8;
          if (local_b8 < bVar12) {
            dVar5 = deRandom_getUint32(&local_80);
            bVar21 = (char)(dVar5 % ((uint)bVar12 - iVar4)) + local_b8;
          }
          sVar3 = sVar2;
          WVar18.m_value = min.m_value;
          if (min.m_value < max.m_value) {
            dVar5 = deRandom_getUint32(&local_80);
            WVar18.m_value = (char)(dVar5 % uVar24) + min.m_value;
            sVar3 = (short)WVar18.m_value;
          }
          cVar13 = WVar18.m_value - (char)(sVar3 % (short)(uVar7 & 0xff));
          bVar16 = max.m_value - cVar13 & 0x7f;
          bVar12 = local_b8;
          if (local_b8 < bVar16) {
            dVar5 = deRandom_getUint32(&local_80);
            bVar12 = (char)(dVar5 % ((uint)bVar16 - iVar4)) + local_b8;
          }
          cVar22 = bVar21 - (char)((short)(char)bVar21 % (short)(uVar7 & 0xff));
          cVar17 = bVar12 - (char)((short)(char)bVar12 % (short)(uVar7 & 0xff));
          if (componentCount < 3) break;
          if (min.m_value < max.m_value) {
            dVar5 = deRandom_getUint32(&local_80);
            cVar9 = (char)(dVar5 % uVar24) + min.m_value;
            cVar9 = cVar9 - (char)((short)cVar9 % (short)(uVar7 & 0xff));
            cVar10 = '\x01';
            if (componentCount != 3) {
              dVar5 = deRandom_getUint32(&local_80);
              cVar10 = (char)(dVar5 % uVar24) + min.m_value;
              cVar10 = cVar10 - (char)((short)cVar10 % (short)(uVar7 & 0xff));
            }
          }
          else {
            cVar9 = min.m_value -
                    (char)((int)((uint)(ushort)(sVar2 >> 0xf) << 0x10 | uVar23 & 0xffff) %
                          (int)(short)(uVar7 & 0xff));
            cVar10 = cVar9;
            if (componentCount == 3) {
              cVar10 = '\x01';
            }
          }
          fVar26 = (float)(int)cVar9 + (float)(int)cVar22;
          uVar25 = -(uint)(-fVar26 <= fVar26);
          if ((((float)iVar4 <= (float)(~uVar25 & (uint)-fVar26 | (uint)fVar26 & uVar25)) &&
              (fVar26 = (float)(int)cVar10 + (float)(int)cVar17, uVar25 = -(uint)(-fVar26 <= fVar26)
              , (float)iVar4 <= (float)(~uVar25 & (uint)-fVar26 | (uint)fVar26 & uVar25))) ||
             (2 < local_a4)) goto LAB_00943b87;
          local_a4 = local_a4 + 1;
        }
        cVar9 = '\0';
        cVar10 = '\x01';
LAB_00943b87:
        iVar6 = iVar8 * (int)local_90;
        iVar1 = (int)local_40;
        cVar22 = cVar22 + cVar19;
        local_48[iVar6] = cVar19;
        local_48[(long)iVar6 + 1] = cVar13;
        local_48[iVar6 + iVar1] = cVar22;
        local_48[iVar6 + 1 + iVar1] = cVar13;
        cVar17 = cVar17 + cVar13;
        lVar11 = (long)((int)local_38 + iVar6);
        local_48[lVar11] = cVar19;
        local_48[lVar11 + 1] = cVar17;
        local_48[iVar6 + (int)local_50] = cVar19;
        local_48[iVar6 + 1 + (int)local_50] = cVar17;
        lVar11 = (long)(iVar6 + (int)local_58);
        local_48[lVar11] = cVar22;
        local_48[lVar11 + 1] = cVar13;
        local_48[iVar6 + (int)local_60] = cVar22;
        local_48[iVar6 + (int)local_60 + 1] = cVar17;
        if (2 < componentCount) {
          lVar11 = 6;
          iVar6 = iVar14;
          do {
            local_48[iVar6] = cVar9;
            iVar6 = iVar6 + iVar1;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
          if (componentCount != 3) {
            lVar11 = 6;
            iVar6 = iVar15;
            do {
              local_48[iVar6] = cVar10;
              iVar6 = iVar6 + iVar1;
              lVar11 = lVar11 + -1;
            } while (lVar11 != 0);
          }
        }
        local_90 = local_90 + 1;
        iVar14 = iVar14 + iVar8;
        iVar15 = iVar15 + iVar8;
      } while (local_90 != local_68);
    }
  }
  return local_70;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}